

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DOMNodeVector.cpp
# Opt level: O3

void __thiscall xercesc_4_0::DOMNodeVector::checkSpace(DOMNodeVector *this)

{
  ulong uVar1;
  XMLSize_t XVar2;
  int iVar3;
  undefined4 extraout_var;
  DOMNode **ppDVar4;
  XMLSize_t XVar5;
  ulong uVar6;
  
  uVar1 = this->nextFreeSlot;
  if (uVar1 == this->allocatedSize) {
    uVar6 = 10;
    if (10 < uVar1 >> 1) {
      uVar6 = uVar1 >> 1;
    }
    iVar3 = (*(*this->data)->_vptr_DOMNode[0xc])();
    ppDVar4 = (DOMNode **)
              (**(code **)(*(long *)(CONCAT44(extraout_var,iVar3) + -8) + 0x20))
                        (CONCAT44(extraout_var,iVar3) + -8,(uVar6 + uVar1) * 8);
    if (ppDVar4 == (DOMNode **)0x0) {
      __assert_fail("newData != 0",
                    "/workspace/llm4binary/github/license_c_cmakelists/apache[P]xerces-c/src/xercesc/dom/impl/DOMNodeVector.cpp"
                    ,0x50,"void xercesc_4_0::DOMNodeVector::checkSpace()");
    }
    XVar2 = this->allocatedSize;
    if (XVar2 != 0) {
      XVar5 = 0;
      do {
        ppDVar4[XVar5] = this->data[XVar5];
        XVar5 = XVar5 + 1;
      } while (XVar2 != XVar5);
    }
    this->allocatedSize = uVar6 + uVar1;
    this->data = ppDVar4;
  }
  return;
}

Assistant:

void DOMNodeVector::checkSpace() {
    if (nextFreeSlot == allocatedSize) {
        XMLSize_t grow = allocatedSize/2;
        if (grow < 10) grow = 10;
        const XMLSize_t newAllocatedSize = allocatedSize + grow;
        DOMDocument *doc = data[0]->getOwnerDocument();

        //DOMNode **newData = new (doc) DOMNode *[newAllocatedSize];
        DOMNode **newData = (DOMNode**) ((DOMDocumentImpl *)doc)->allocate(sizeof(DOMNode*) * newAllocatedSize);

        assert(newData != 0);
        for (XMLSize_t i=0; i<allocatedSize; i++) {
            newData[i] = data[i];
        }
        // delete [] data;  // revisit.  Can't delete!  Recycle?
        allocatedSize = newAllocatedSize;
        data = newData;
    }
}